

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void RunLegalizeArrayValues(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  SynBase *pSVar1;
  VmInstruction *original;
  VmFunction *pVVar2;
  TypeBase *pTVar3;
  TypeBase *type;
  VmConstant *address;
  VmValue *pVVar4;
  VmInstruction *replacement;
  VmInstruction *pVVar5;
  uint offset;
  VmValue *value_00;
  VmInstruction *pVVar6;
  VmBlock **ppVVar7;
  VmBlock *value_01;
  ulong uVar8;
  
  if ((value == (VmValue *)0x0) || (pVVar2 = (VmFunction *)value, value->typeID != 4)) {
    pVVar2 = (VmFunction *)0x0;
  }
  if (pVVar2 == (VmFunction *)0x0) {
    if ((value == (VmValue *)0x0) || (value->typeID != 3)) {
      value = (VmValue *)0x0;
    }
    if ((VmBlock *)value == (VmBlock *)0x0) {
      return;
    }
    ppVVar7 = &module->currentBlock;
    module->currentBlock = (VmBlock *)value;
    pVVar6 = ((VmBlock *)value)->firstInstruction;
    while (original = pVVar6, original != (VmInstruction *)0x0) {
      pVVar6 = original->nextSibling;
      if (original->cmd == VM_INST_ARRAY) {
        pTVar3 = GetBaseType(ctx,(original->super_VmValue).type);
        pTVar3 = (TypeBase *)pTVar3[1]._vptr_TypeBase;
        ((VmBlock *)value)->insertPoint = original;
        pSVar1 = (original->super_VmValue).source;
        type = GetBaseType(ctx,(original->super_VmValue).type);
        offset = 1;
        address = anon_unknown.dwarf_13465d::CreateAlloca(ctx,module,pSVar1,type,"array",true);
        FinalizeAlloca(ctx,module,address->container);
        if ((original->arguments).count != 0) {
          uVar8 = 0;
          do {
            value_00 = (original->arguments).data[uVar8];
            if ((value_00 == (VmValue *)0x0) || (pVVar4 = value_00, value_00->typeID != 2)) {
              pVVar4 = (VmValue *)0x0;
            }
            if ((pVVar4 != (VmValue *)0x0) && (*(int *)&pVVar4[1]._vptr_VmValue == 0x11)) {
              if (pVVar4[1].type.type == VM_TYPE_VOID) {
                __assert_fail("index < count",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                              ,0x199,
                              "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                             );
              }
              value_00 = (VmValue *)**(undefined8 **)&pVVar4[1].typeID;
            }
            anon_unknown.dwarf_13465d::CreateStore
                      (ctx,module,(original->super_VmValue).source,pTVar3,&address->super_VmValue,
                       value_00,(int)pTVar3->size * (int)uVar8);
            offset = (uint)value_00;
            uVar8 = uVar8 + 1;
          } while (uVar8 < (original->arguments).count);
        }
        pSVar1 = (original->super_VmValue).source;
        pTVar3 = GetBaseType(ctx,(original->super_VmValue).type);
        replacement = (VmInstruction *)
                      anon_unknown.dwarf_13465d::CreateLoad
                                (ctx,module,pSVar1,pTVar3,&address->super_VmValue,offset);
        if ((replacement == (VmInstruction *)0x0) ||
           (pVVar5 = replacement, (replacement->super_VmValue).typeID != 2)) {
          pVVar5 = (VmInstruction *)0x0;
        }
        if (pVVar5 != (VmInstruction *)0x0) {
          pVVar6 = pVVar5;
        }
        anon_unknown.dwarf_13465d::ReplaceValueUsersWith
                  (module,&original->super_VmValue,(VmValue *)replacement,(uint *)0x0);
        ((VmBlock *)value)->insertPoint = ((VmBlock *)value)->lastInstruction;
      }
    }
  }
  else {
    ppVVar7 = (VmBlock **)&module->currentFunction;
    module->currentFunction = pVVar2;
    for (value_01 = pVVar2->firstBlock; value_01 != (VmBlock *)0x0; value_01 = value_01->nextSibling
        ) {
      RunLegalizeArrayValues(ctx,module,&value_01->super_VmValue);
    }
  }
  *ppVVar7 = (VmBlock *)0x0;
  return;
}

Assistant:

void RunLegalizeArrayValues(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		module->currentFunction = function;

		for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
			RunLegalizeArrayValues(ctx, module, curr);

		module->currentFunction = NULL;
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		module->currentBlock = block;

		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			// If replacement succeeds, we will continue from the same place to handle multi-level arrays
			VmInstruction *next = curr->nextSibling;

			if(curr->cmd == VM_INST_ARRAY)
			{
				TypeArray *typeArray = getType<TypeArray>(GetBaseType(ctx, curr->type));

				TypeBase *elementType = typeArray->subType;

				block->insertPoint = curr;

				VmConstant *address = CreateAlloca(ctx, module, curr->source, GetBaseType(ctx, curr->type), "array", true);

				FinalizeAlloca(ctx, module, address->container);

				for(unsigned i = 0; i < curr->arguments.size(); i++)
				{
					VmValue *element = curr->arguments[i];

					if(VmInstruction *elementInst = getType<VmInstruction>(element))
					{
						if(elementInst->cmd == VM_INST_DOUBLE_TO_FLOAT)
							element = elementInst->arguments[0];
					}

					CreateStore(ctx, module, curr->source, elementType, address, element, unsigned(elementType->size * i));
				}

				VmValue *load = CreateLoad(ctx, module, curr->source, GetBaseType(ctx, curr->type), address, 0);

				if(VmInstruction *loadInst = getType<VmInstruction>(load))
					next = loadInst;

				ReplaceValueUsersWith(module, curr, load, NULL);

				block->insertPoint = block->lastInstruction;
			}

			curr = next;
		}

		module->currentBlock = NULL;
	}
}